

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O0

SSL_CREDENTIAL *
SSL_CREDENTIAL_new_spake2plusv1_server
          (uint8_t *context,size_t context_len,uint8_t *client_identity,size_t client_identity_len,
          uint8_t *server_identity,size_t server_identity_len,uint32_t rate_limit,uint8_t *w0,
          size_t w0_len,uint8_t *registration_record,size_t registration_record_len)

{
  Span<const_unsigned_char> server_identity_00;
  bool bVar1;
  pointer psVar2;
  Span<const_unsigned_char> client_identity_00;
  Span<const_unsigned_char> context_00;
  Span<const_unsigned_char> local_b0 [2];
  Span<const_unsigned_char> local_90;
  undefined4 local_7c;
  Span<const_unsigned_char> local_78;
  Span<const_unsigned_char> local_68;
  Span<const_unsigned_char> local_58;
  unique_ptr<ssl_credential_st,_bssl::internal::Deleter> local_48;
  UniquePtr<SSL_CREDENTIAL> cred;
  size_t server_identity_len_local;
  uint8_t *server_identity_local;
  size_t client_identity_len_local;
  uint8_t *client_identity_local;
  size_t context_len_local;
  uint8_t *context_local;
  
  if (((w0_len != 0x20) || (registration_record_len != 0x41)) ||
     ((context == (uint8_t *)0x0 && (context_len != 0)))) {
    return (SSL_CREDENTIAL *)0x0;
  }
  cred._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_credential_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<ssl_credential_st,_bssl::internal::Deleter,_true,_true>)server_identity_len;
  bssl::Span<const_unsigned_char>::Span(&local_58,context,context_len);
  bssl::Span<const_unsigned_char>::Span(&local_68,client_identity,client_identity_len);
  bssl::Span<const_unsigned_char>::Span
            (&local_78,server_identity,
             (size_t)cred._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl);
  server_identity_00.size_ = local_78.size_;
  server_identity_00.data_ = local_78.data_;
  client_identity_00.size_ = (size_t)local_68.data_;
  client_identity_00.data_ = (uchar *)local_58.size_;
  context_00.size_ = (size_t)local_58.data_;
  context_00.data_ = (uchar *)0x3;
  ssl_credential_new_spake2plusv1
            ((SSLCredentialType)&local_48,context_00,client_identity_00,server_identity_00,
             (uint32_t)local_68.size_);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_48);
  if (bVar1) {
    psVar2 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->(&local_48);
    bssl::Span<const_unsigned_char>::Span(&local_90,w0,0x20);
    bVar1 = bssl::Array<unsigned_char>::CopyFrom(&psVar2->password_verifier_w0,local_90);
    if (bVar1) {
      psVar2 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->(&local_48);
      bssl::Span<const_unsigned_char>::Span(local_b0,registration_record,0x41);
      bVar1 = bssl::Array<unsigned_char>::CopyFrom(&psVar2->registration_record,local_b0[0]);
      if (bVar1) {
        context_local =
             (uint8_t *)
             std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::release(&local_48);
        goto LAB_0019f1ef;
      }
    }
    context_local = (uint8_t *)0x0;
  }
  else {
    context_local = (uint8_t *)0x0;
  }
LAB_0019f1ef:
  local_7c = 1;
  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr(&local_48);
  return (SSL_CREDENTIAL *)context_local;
}

Assistant:

SSL_CREDENTIAL *SSL_CREDENTIAL_new_spake2plusv1_server(
    const uint8_t *context, size_t context_len, const uint8_t *client_identity,
    size_t client_identity_len, const uint8_t *server_identity,
    size_t server_identity_len, uint32_t rate_limit, const uint8_t *w0,
    size_t w0_len, const uint8_t *registration_record,
    size_t registration_record_len) {
  if (w0_len != spake2plus::kVerifierSize ||
      registration_record_len != spake2plus::kRegistrationRecordSize ||
      (context == nullptr && context_len != 0)) {
    return nullptr;
  }

  UniquePtr<SSL_CREDENTIAL> cred = ssl_credential_new_spake2plusv1(
      SSLCredentialType::kSPAKE2PlusV1Server, Span(context, context_len),
      Span(client_identity, client_identity_len),
      Span(server_identity, server_identity_len), rate_limit);
  if (!cred) {
    return nullptr;
  }

  if (!cred->password_verifier_w0.CopyFrom(Span(w0, w0_len)) ||
      !cred->registration_record.CopyFrom(
          Span(registration_record, registration_record_len))) {
    return nullptr;
  }

  return cred.release();
}